

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveComments.cpp
# Opt level: O0

void Assimp::CommentRemover::RemoveLineComments(char *szComment,char *szBuffer,char chReplacement)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  bool bVar3;
  size_t len;
  char *pcStack_18;
  char chReplacement_local;
  char *szBuffer_local;
  char *szComment_local;
  
  bVar3 = false;
  if ((szComment != (char *)0x0) && (bVar3 = false, szBuffer != (char *)0x0)) {
    bVar3 = *szComment != '\0';
  }
  if (bVar3) {
    __n = strlen(szComment);
    pcStack_18 = szBuffer;
    do {
      if (*pcStack_18 == '\0') {
        return;
      }
      if ((*pcStack_18 == '\"') || (*pcStack_18 == '\'')) {
        do {
          pcVar2 = pcStack_18 + 1;
          bVar3 = false;
          if ((*pcStack_18 != '\0') && (bVar3 = false, *pcVar2 != '\"')) {
            bVar3 = *pcVar2 != '\'';
          }
          pcStack_18 = pcVar2;
        } while (bVar3);
      }
      iVar1 = strncmp(pcStack_18,szComment,__n);
      if (iVar1 == 0) {
        while (bVar3 = IsLineEnd<char>(*pcStack_18), ((bVar3 ^ 0xffU) & 1) != 0) {
          *pcStack_18 = chReplacement;
          pcStack_18 = pcStack_18 + 1;
        }
        if (*pcStack_18 == '\0') {
          return;
        }
      }
      pcStack_18 = pcStack_18 + 1;
    } while( true );
  }
  __assert_fail("__null != szComment && __null != szBuffer && *szComment",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/RemoveComments.cpp"
                ,0x3a,
                "static void Assimp::CommentRemover::RemoveLineComments(const char *, char *, char)"
               );
}

Assistant:

void CommentRemover::RemoveLineComments(const char* szComment,
    char* szBuffer, char chReplacement /* = ' ' */)
{
    // validate parameters
    ai_assert(NULL != szComment && NULL != szBuffer && *szComment);

    const size_t len = strlen(szComment);
    while (*szBuffer)   {

        // skip over quotes
        if (*szBuffer == '\"' || *szBuffer == '\'')
            while (*szBuffer++ && *szBuffer != '\"' && *szBuffer != '\'');

        if (!strncmp(szBuffer,szComment,len)) {
            while (!IsLineEnd(*szBuffer))
                *szBuffer++ = chReplacement;

            if (!*szBuffer) {
                break;
            }
        }
        ++szBuffer;
    }
}